

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin_smoothing.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *path;
  int height_00;
  int width_00;
  stbi_uc *input;
  uchar *output;
  double dVar1;
  int channels;
  int height;
  int width;
  char drive [3];
  char ext [256];
  char fname [256];
  char dir [256];
  char out_file [1024];
  int local_750;
  int local_74c;
  int local_748;
  char local_743 [3];
  double local_740;
  char local_738 [256];
  char local_638 [256];
  char local_538 [256];
  char local_438 [1032];
  
  printf("Image Processing \n ");
  printf("blog:http://cpuimage.cnblogs.com/ \n ");
  printf("Skin Smoothing\n ");
  if (argc < 2) {
    printf("usage: \n ");
    printf("%s filename \n ",*argv);
    printf("%s image.jpg \n ",*argv);
  }
  else {
    path = argv[1];
    splitpath(path,local_743,local_538,local_638,local_738);
    sprintf(local_438,"%s%s%s_out.jpg",local_743,local_538);
    local_748 = 0;
    local_74c = 0;
    local_750 = 0;
    input = stbi_load(path,&local_748,&local_74c,&local_750,0);
    width_00 = local_748;
    height_00 = local_74c;
    if (input == (stbi_uc *)0x0) {
      printf("load file: %s fail!\n",path);
    }
    else {
      output = (uchar *)calloc((long)(local_750 * local_748 * local_74c),1);
      if (output != (uchar *)0x0) {
        local_740 = now();
        skinSmoothing(input,output,width_00,height_00,local_750,10,0);
        dVar1 = now();
        printf("elapsed time: %d ms.\n ",(ulong)(uint)(int)((dVar1 - local_740) * 1000.0));
        saveImage(local_438,width_00,height_00,local_750,output);
        free(output);
      }
      free(input);
    }
    puts("press any key to exit. ");
  }
  getchar();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    printf("Image Processing \n ");
    printf("blog:http://cpuimage.cnblogs.com/ \n ");
    printf("Skin Smoothing\n ");
    if (argc < 2) {
        printf("usage: \n ");
        printf("%s filename \n ", argv[0]);
        printf("%s image.jpg \n ", argv[0]);
        getchar();
        return 0;
    }
    char *in_file = argv[1];
    char drive[3];
    char dir[256];
    char fname[256];
    char ext[256];
    char out_file[1024];
    splitpath(in_file, drive, dir, fname, ext);
    sprintf(out_file, "%s%s%s_out.jpg", drive, dir, fname);
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char *input = NULL;
    input = loadImage(in_file, &width, &height, &channels);
    if (input) {
        unsigned char *output = (unsigned char *) calloc(width * channels * height * sizeof(unsigned char), 1);
        if (output) {
            int smoothingLevel = 10;
            int apply_skin_filter = 0;
            double startTime = now();
            skinSmoothing(input, output, width, height, channels, smoothingLevel, apply_skin_filter);
            double elapsed = calcElapsed(startTime, now());
            printf("elapsed time: %d ms.\n ", (int) (elapsed * 1000));
            saveImage(out_file, width, height, channels, output);
            free(output);
        }
        free(input);
    } else {
        printf("load file: %s fail!\n", in_file);
    }
    printf("press any key to exit. \n");
    getchar();
    return 0;
}